

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O2

Real __thiscall amrex::MLCellLinOp::AnyNormInfMask(MLCellLinOp *this,int amrlev,Any *a,bool local)

{
  bool bVar1;
  uint uVar2;
  FabArray<amrex::FArrayBox> *this_00;
  EBFArrayBoxFactory *this_01;
  FabArray<amrex::FArrayBox> *this_02;
  long lVar3;
  long lVar4;
  ulong uVar5;
  _Head_base<0UL,_amrex::iMultiFab_*,_false> fine_mask;
  long lVar6;
  int iVar7;
  long lVar8;
  int k_1;
  long lVar9;
  long lVar10;
  long lVar11;
  int j_1;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  double dVar21;
  Real RVar22;
  Real local_1f8;
  Array4<const_double> local_170;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter mfi;
  
  this_00 = &Any::get<amrex::MultiFab>(a)->super_FabArray<amrex::FArrayBox>;
  iVar7 = (this->super_MLLinOp).m_num_amr_levels + -1;
  uVar2 = (*(this->super_MLLinOp)._vptr_MLLinOp[5])(this);
  bVar1 = FabArray<amrex::FArrayBox>::isAllRegular(this_00);
  if (!bVar1) {
    this_01 = (EBFArrayBoxFactory *)
              __dynamic_cast(**(undefined8 **)
                               &(this->super_MLLinOp).m_factory.
                                super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                                .
                                super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                             ,&FabFactory<amrex::FArrayBox>::typeinfo,&EBFArrayBoxFactory::typeinfo,
                             0);
    this_02 = &EBFArrayBoxFactory::getVolFrac(this_01)->super_FabArray<amrex::FArrayBox>;
    if (iVar7 == amrlev) {
      MFIter::MFIter(&mfi,&this_00->super_FabArrayBase,true);
      uVar20 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar20 = 0;
      }
      local_1f8 = 0.0;
      while (mfi.currentIndex < mfi.endIndex) {
        MFIter::tilebox((Box *)&local_110,&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_170,this_00,&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_d0,this_02,&mfi);
        lVar3 = (long)(int)local_110.p;
        lVar11 = (long)local_110.p._4_4_;
        lVar12 = (long)(int)local_110.jstride;
        lVar13 = (lVar11 - local_170.begin.y) * local_170.jstride * 8 +
                 (lVar12 - local_170.begin.z) * local_170.kstride * 8 + lVar3 * 8 +
                 (long)local_170.begin.x * -8 + (long)local_170.p;
        for (uVar5 = 0; lVar16 = lVar12, lVar17 = lVar13,
            lVar10 = (lVar11 - local_d0.begin.y) * local_d0.jstride * 8 +
                     (lVar12 - local_d0.begin.z) * local_d0.kstride * 8 + lVar3 * 8 +
                     (long)local_d0.begin.x * -8 + (long)local_d0.p, uVar5 != uVar20;
            uVar5 = uVar5 + 1) {
          for (; lVar4 = lVar11, lVar8 = lVar10, lVar9 = lVar17, lVar16 <= local_110.kstride._4_4_;
              lVar16 = lVar16 + 1) {
            for (; lVar4 <= (int)local_110.kstride; lVar4 = lVar4 + 1) {
              for (lVar15 = 0; lVar3 + lVar15 <= (long)local_110.jstride._4_4_; lVar15 = lVar15 + 1)
              {
                dVar21 = ABS(*(double *)(lVar9 + lVar15 * 8) * *(double *)(lVar8 + lVar15 * 8));
                if (dVar21 <= local_1f8) {
                  dVar21 = local_1f8;
                }
                local_1f8 = dVar21;
              }
              lVar8 = lVar8 + local_d0.jstride * 8;
              lVar9 = lVar9 + local_170.jstride * 8;
            }
            lVar17 = lVar17 + local_170.kstride * 8;
            lVar10 = lVar10 + local_d0.kstride * 8;
          }
          lVar13 = lVar13 + local_170.nstride * 8;
        }
        MFIter::operator++(&mfi);
      }
    }
    else {
      MFIter::MFIter(&mfi,&this_00->super_FabArrayBase,true);
      uVar20 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar20 = 0;
      }
      local_1f8 = 0.0;
      while (mfi.currentIndex < mfi.endIndex) {
        MFIter::tilebox(&local_12c,&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_170,this_00,&mfi);
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  ((Array4<const_int> *)&local_d0,
                   (FabArray<amrex::IArrayBox> *)
                   (this->m_norm_fine_mask).
                   super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
                   super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,
                   &mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_110,this_02,&mfi);
        lVar3 = (long)local_12c.smallend.vect[0];
        lVar16 = (long)local_12c.smallend.vect[1];
        lVar12 = (long)local_12c.smallend.vect[2];
        lVar11 = CONCAT44(local_110.kstride._4_4_,(int)local_110.kstride) * 8;
        lVar13 = CONCAT44(local_110.jstride._4_4_,(int)local_110.jstride) * 8;
        lVar17 = (lVar16 - local_170.begin.y) * local_170.jstride * 8 +
                 (lVar12 - local_170.begin.z) * local_170.kstride * 8 + lVar3 * 8 +
                 (long)local_170.begin.x * -8 + (long)local_170.p;
        for (uVar5 = 0; lVar10 = lVar12,
            lVar4 = (lVar16 - local_110.begin.y) * lVar13 + (lVar12 - local_110.begin.z) * lVar11 +
                    lVar3 * 8 + (long)local_110.begin.x * -8 +
                    CONCAT44(local_110.p._4_4_,(int)local_110.p), lVar8 = lVar17,
            lVar9 = (lVar16 - local_d0.begin.y) * local_d0.jstride * 4 +
                    (lVar12 - local_d0.begin.z) * local_d0.kstride * 4 + lVar3 * 4 +
                    (long)local_d0.begin.x * -4 + (long)local_d0.p, uVar5 != uVar20;
            uVar5 = uVar5 + 1) {
          for (; lVar15 = lVar9, lVar14 = lVar16, lVar18 = lVar8, lVar19 = lVar4,
              lVar10 <= local_12c.bigend.vect[2]; lVar10 = lVar10 + 1) {
            for (; lVar14 <= local_12c.bigend.vect[1]; lVar14 = lVar14 + 1) {
              for (lVar6 = 0; lVar3 + lVar6 <= (long)local_12c.bigend.vect[0]; lVar6 = lVar6 + 1) {
                dVar21 = local_1f8;
                if ((*(int *)(lVar15 + lVar6 * 4) != 0) &&
                   (dVar21 = ABS(*(double *)(lVar18 + lVar6 * 8) * *(double *)(lVar19 + lVar6 * 8)),
                   dVar21 <= local_1f8)) {
                  dVar21 = local_1f8;
                }
                local_1f8 = dVar21;
              }
              lVar15 = lVar15 + local_d0.jstride * 4;
              lVar18 = lVar18 + local_170.jstride * 8;
              lVar19 = lVar19 + lVar13;
            }
            lVar4 = lVar4 + lVar11;
            lVar8 = lVar8 + local_170.kstride * 8;
            lVar9 = lVar9 + local_d0.kstride * 4;
          }
          lVar17 = lVar17 + local_170.nstride * 8;
        }
        MFIter::operator++(&mfi);
      }
    }
    MFIter::~MFIter(&mfi);
    return local_1f8;
  }
  if (iVar7 == amrlev) {
    fine_mask._M_head_impl = (iMultiFab *)0x0;
  }
  else {
    fine_mask._M_head_impl =
         *(iMultiFab **)
          &(this->m_norm_fine_mask).
           super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
           super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
  }
  RVar22 = MLLinOp::MFNormInf(&this->super_MLLinOp,(MultiFab *)this_00,fine_mask._M_head_impl,true);
  return RVar22;
}

Assistant:

Real
MLCellLinOp::AnyNormInfMask (int amrlev, Any const& a, bool local) const
{
    AMREX_ASSERT(a.is<MultiFab>());
    auto& mf = a.get<MultiFab>();

    const int finest_level = NAMRLevels() - 1;
    Real norm = 0._rt;
#ifdef AMREX_USE_EB
    const int ncomp = getNComp();
    if (! mf.isAllRegular()) {
        auto factory = dynamic_cast<EBFArrayBoxFactory const*>(Factory(amrlev));
        const MultiFab& vfrac = factory->getVolFrac();
        if (amrlev == finest_level) {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion()) {
                auto const& ma = mf.const_arrays();
                auto const& vfrac_ma = vfrac.const_arrays();
                norm = ParReduce(TypeList<ReduceOpMax>{}, TypeList<Real>{},
                                 mf, IntVect(0), ncomp,
                                 [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n)
                                     -> GpuTuple<Real>
                                 {
                                     return amrex::Math::abs(ma[box_no](i,j,k,n)
                                                             *vfrac_ma[box_no](i,j,k));
                                 });
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:norm)
#endif
                for (MFIter mfi(mf,true); mfi.isValid(); ++mfi) {
                    Box const& bx = mfi.tilebox();
                    auto const& fab = mf.const_array(mfi);
                    auto const& v = vfrac.const_array(mfi);
                    AMREX_LOOP_4D(bx, ncomp, i, j, k, n,
                    {
                        norm = std::max(norm, amrex::Math::abs(fab(i,j,k,n)*v(i,j,k)));
                    });
                }
            }
        } else {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion()) {
                auto const& ma = mf.const_arrays();
                auto const& mask_ma = m_norm_fine_mask[amrlev]->const_arrays();
                auto const& vfrac_ma = vfrac.const_arrays();
                norm = ParReduce(TypeList<ReduceOpMax>{}, TypeList<Real>{},
                                 mf, IntVect(0), ncomp,
                                 [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n)
                                     -> GpuTuple<Real>
                                 {
                                     if (mask_ma[box_no](i,j,k)) {
                                         return amrex::Math::abs(ma[box_no](i,j,k,n)
                                                                 *vfrac_ma[box_no](i,j,k));
                                     } else {
                                         return Real(0.0);
                                     }
                                 });
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:norm)
#endif
                for (MFIter mfi(mf,true); mfi.isValid(); ++mfi) {
                    Box const& bx = mfi.tilebox();
                    auto const& fab = mf.const_array(mfi);
                    auto const& mask = m_norm_fine_mask[amrlev]->const_array(mfi);
                    auto const& v = vfrac.const_array(mfi);
                    AMREX_LOOP_4D(bx, ncomp, i, j, k, n,
                    {
                        if (mask(i,j,k)) {
                            norm = std::max(norm, amrex::Math::abs(fab(i,j,k,n)*v(i,j,k)));
                        }
                    });
                }
            }
        }
    } else
#endif
    {
        iMultiFab const* fine_mask = (amrlev == finest_level)
            ? nullptr : m_norm_fine_mask[amrlev].get();
        norm = MFNormInf(mf, fine_mask, true);
    }

    if (!local) ParallelAllReduce::Max(norm, ParallelContext::CommunicatorSub());
    return norm;
}